

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O0

void occ_doit<occurrence_granular>(occurrence_granular *q)

{
  int iVar1;
  size_t sVar2;
  int minutes;
  int days;
  int i;
  int occ_minute;
  int occ_hour;
  int occ_day;
  int occ_month;
  int occ_year;
  occurrence_granular *q_local;
  
  _occ_month = q;
  sVar2 = fread(q,0x10,1,_stdin);
  minutes = (int)sVar2;
  while (minutes != 0) {
    d((long)(int)(_occ_month->occ_date_id /
                 (long)(int)((uint)((granular_date_ != 0 ^ 0xffU) & 1) * -0x59f + 0x5a0)),&occ_day,
      &occ_hour,&occ_minute);
    if (granular_date_ == 0) {
      printf("%d,%d,%d,%d,%d\n",(ulong)(uint)_occ_month->event_id,(ulong)(uint)_occ_month->period_no
             ,(ulong)(uint)occ_day,(ulong)(uint)occ_hour,(ulong)(uint)occ_minute);
    }
    else {
      iVar1 = (int)(_occ_month->occ_date_id % 0x5a0);
      printf("%d,%d,%d,%d,%d,%d,%d\n",(ulong)(uint)_occ_month->event_id,
             (ulong)(uint)_occ_month->period_no,(ulong)(uint)occ_day,(ulong)(uint)occ_hour,
             (ulong)(uint)occ_minute,iVar1 / 0x3c,iVar1 % 0x3c);
    }
    sVar2 = fread(_occ_month,0x10,1,_stdin);
    minutes = (int)sVar2;
  }
  return;
}

Assistant:

void occ_doit(T &q)
{

	int occ_year, occ_month, occ_day;
	int occ_hour = 0;
	int occ_minute = 0;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		int days = q.occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);
		if (granular_date_) {
			int minutes = q.occ_date_id % 1440;
			occ_hour = minutes / 60;
			occ_minute = minutes % 60;
			printf("%d,%d,%d,%d,%d,%d,%d\n", q.event_id,
			       q.period_no, occ_year, occ_month, occ_day,
			       occ_hour, occ_minute);
		} else {
			printf("%d,%d,%d,%d,%d\n",  q.event_id, q.period_no,
			       occ_year, occ_month, occ_day);
		}
		i = fread(&q, sizeof(q), 1, stdin);
	}

}